

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O3

void cf2_hint_init(CF2_Hint hint,CF2_ArrStack stemHintArray,size_t indexStemHint,CF2_Font font,
                  CF2_F16Dot16 hintOrigin,CF2_F16Dot16 scale,FT_Bool bottom)

{
  int *piVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  
  hint->csCoord = 0;
  hint->dsCoord = 0;
  *(undefined8 *)&hint->scale = 0;
  *(undefined8 *)hint = 0;
  hint->index = 0;
  sVar8 = indexStemHint;
  if (stemHintArray->count <= indexStemHint) {
    piVar1 = stemHintArray->error;
    if ((piVar1 != (int *)0x0) && (*piVar1 == 0)) {
      *piVar1 = 0x82;
    }
    sVar8 = 0;
  }
  pvVar2 = stemHintArray->ptr;
  lVar9 = sVar8 * stemHintArray->sizeItem;
  iVar10 = *(int *)((long)pvVar2 + lVar9 + 4);
  iVar7 = *(int *)((long)pvVar2 + lVar9 + 8);
  iVar5 = iVar7 - iVar10;
  if (iVar5 == -0x140000) {
    if (bottom != '\0') {
LAB_00155c8a:
      hint->flags = 0;
      iVar7 = hintOrigin + hint->csCoord;
      hint->csCoord = iVar7;
      hint->scale = scale;
      hint->index = indexStemHint;
      goto LAB_00155d17;
    }
    uVar6 = 2;
LAB_00155ce5:
    hint->flags = uVar6;
    iVar7 = iVar10 + hintOrigin + font->darkenY * 2;
    hint->csCoord = iVar7;
    hint->scale = scale;
    hint->index = indexStemHint;
    lVar4 = 0x10;
  }
  else {
    if (iVar5 == -0x150000) {
      uVar6 = 1;
      if (bottom == '\0') goto LAB_00155c8a;
    }
    else {
      iVar3 = iVar10;
      if (iVar5 < 0) {
        iVar3 = iVar7;
        iVar7 = iVar10;
      }
      iVar10 = iVar7;
      iVar7 = iVar3;
      uVar6 = 4;
      if (bottom == '\0') {
        uVar6 = 8;
        goto LAB_00155ce5;
      }
    }
    hint->flags = uVar6;
    iVar7 = iVar7 + hintOrigin;
    hint->csCoord = iVar7;
    hint->scale = scale;
    hint->index = indexStemHint;
    lVar4 = 0xc;
  }
  if (*(char *)((long)pvVar2 + lVar9) != '\0') {
    hint->dsCoord = *(CF2_F16Dot16 *)((char *)((long)pvVar2 + lVar9) + lVar4);
    hint->flags = uVar6 | 0x10;
    return;
  }
LAB_00155d17:
  hint->dsCoord =
       (CF2_F16Dot16)
       ((ulong)(((long)scale * (long)iVar7 >> 0x3f) + (long)scale * (long)iVar7 + 0x8000) >> 0x10);
  return;
}

Assistant:

static void
  cf2_hint_init( CF2_Hint            hint,
                 const CF2_ArrStack  stemHintArray,
                 size_t              indexStemHint,
                 const CF2_Font      font,
                 CF2_Fixed           hintOrigin,
                 CF2_Fixed           scale,
                 FT_Bool             bottom )
  {
    CF2_Fixed               width;
    const CF2_StemHintRec*  stemHint;


    FT_ZERO( hint );

    stemHint = (const CF2_StemHintRec*)cf2_arrstack_getPointer(
                                         stemHintArray,
                                         indexStemHint );

    width = SUB_INT32( stemHint->max, stemHint->min );

    if ( width == cf2_intToFixed( -21 ) )
    {
      /* ghost bottom */

      if ( bottom )
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_GhostBottom;
      }
      else
        hint->flags = 0;
    }

    else if ( width == cf2_intToFixed( -20 ) )
    {
      /* ghost top */

      if ( bottom )
        hint->flags = 0;
      else
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_GhostTop;
      }
    }

    else if ( width < 0 )
    {
      /* inverted pair */

      /*
       * Hints with negative widths were produced by an early version of a
       * non-Adobe font tool.  The Type 2 spec allows edge (ghost) hints
       * with negative widths, but says
       *
       *   All other negative widths have undefined meaning.
       *
       * CoolType has a silent workaround that negates the hint width; for
       * permissive mode, we do the same here.
       *
       * Note: Such fonts cannot use ghost hints, but should otherwise work.
       * Note: Some poor hints in our faux fonts can produce negative
       *       widths at some blends.  For example, see a light weight of
       *       `u' in ASerifMM.
       *
       */
      if ( bottom )
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_PairBottom;
      }
      else
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_PairTop;
      }
    }

    else
    {
      /* normal pair */

      if ( bottom )
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_PairBottom;
      }
      else
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_PairTop;
      }
    }

    /* Now that ghost hints have been detected, adjust this edge for      */
    /* darkening.  Bottoms are not changed; tops are incremented by twice */
    /* `darkenY'.                                                         */
    if ( cf2_hint_isTop( hint ) )
      hint->csCoord = ADD_INT32( hint->csCoord, 2 * font->darkenY );

    hint->csCoord = ADD_INT32( hint->csCoord, hintOrigin );
    hint->scale   = scale;
    hint->index   = indexStemHint;   /* index in original stem hint array */

    /* if original stem hint has been used, use the same position */
    if ( hint->flags != 0 && stemHint->used )
    {
      if ( cf2_hint_isTop( hint ) )
        hint->dsCoord = stemHint->maxDS;
      else
        hint->dsCoord = stemHint->minDS;

      cf2_hint_lock( hint );
    }
    else
      hint->dsCoord = FT_MulFix( hint->csCoord, scale );
  }